

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O1

int __thiscall ncnn::LSTM::forward(LSTM *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _h;
  int iVar1;
  size_t sVar2;
  int *piVar3;
  int iVar4;
  void *__src;
  ulong uVar5;
  void *__dest;
  bool bVar6;
  int local_264;
  Mat m_1;
  Mat m;
  Mat cell;
  Mat m_2;
  Mat hidden;
  Mat local_c0;
  Mat local_78;
  
  _h = bottom_blob->h;
  iVar1 = this->direction;
  hidden.cstep = 0;
  hidden.data = (void *)0x0;
  hidden.refcount._0_4_ = 0;
  hidden.refcount._4_4_ = 0;
  hidden.elemsize._0_4_ = 0;
  hidden._20_8_ = 0;
  hidden.allocator = (Allocator *)0x0;
  hidden.dims = 0;
  hidden.w = 0;
  hidden.h = 0;
  hidden.d = 0;
  hidden.c = 0;
  Mat::create(&hidden,this->num_output,4,opt->workspace_allocator);
  iVar4 = -100;
  if ((hidden.data == (void *)0x0) || ((long)hidden.c * hidden.cstep == 0)) goto LAB_00221b08;
  if (0 < hidden.c * (int)hidden.cstep) {
    memset(hidden.data,0,(ulong)(uint)(hidden.c * (int)hidden.cstep) << 2);
  }
  cell.cstep = 0;
  cell.data = (void *)0x0;
  cell.refcount._0_4_ = 0;
  cell.refcount._4_4_ = 0;
  cell.elemsize._0_4_ = 0;
  cell._20_8_ = 0;
  cell.allocator = (Allocator *)0x0;
  cell.dims = 0;
  cell.w = 0;
  cell.h = 0;
  cell.d = 0;
  cell.c = 0;
  Mat::create(&cell,this->num_output,4,opt->workspace_allocator);
  iVar4 = -100;
  if ((cell.data != (void *)0x0) && ((long)cell.c * cell.cstep != 0)) {
    if (0 < cell.c * (int)cell.cstep) {
      memset(cell.data,0,(ulong)(uint)(cell.c * (int)cell.cstep) << 2);
    }
    Mat::create(top_blob,this->num_output << (iVar1 == 2),_h,4,opt->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if ((uint)this->direction < 2) {
        bVar6 = (this->weight_xc_data).dims == 3;
        m.w = (this->weight_xc_data).w;
        m.h = (this->weight_xc_data).h;
        m.c = 1;
        if (!bVar6) {
          m.c = (this->weight_xc_data).d;
        }
        m.dims = bVar6 ^ 3;
        m.allocator = (this->weight_xc_data).allocator;
        m.elempack = (this->weight_xc_data).elempack;
        m.data = (this->weight_xc_data).data;
        sVar2 = (this->weight_xc_data).elemsize;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = (undefined4)sVar2;
        m.elemsize._4_4_ = (undefined4)(sVar2 >> 0x20);
        m.d = 1;
        m.cstep = (long)m.h * (long)m.w;
        bVar6 = (this->bias_c_data).dims == 3;
        m_1.w = (this->bias_c_data).w;
        m_1.h = (this->bias_c_data).h;
        m_1.c = 1;
        if (!bVar6) {
          m_1.c = (this->bias_c_data).d;
        }
        m_1.dims = bVar6 ^ 3;
        m_1.allocator = (this->bias_c_data).allocator;
        m_1.elempack = (this->bias_c_data).elempack;
        m_1.data = (this->bias_c_data).data;
        sVar2 = (this->bias_c_data).elemsize;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = (undefined4)sVar2;
        m_1.elemsize._4_4_ = (undefined4)(sVar2 >> 0x20);
        m_1.d = 1;
        m_1.cstep = (long)m_1.h * (long)m_1.w;
        bVar6 = (this->weight_hc_data).dims == 3;
        m_2.w = (this->weight_hc_data).w;
        m_2.h = (this->weight_hc_data).h;
        m_2.c = 1;
        if (!bVar6) {
          m_2.c = (this->weight_hc_data).d;
        }
        m_2.dims = bVar6 ^ 3;
        m_2.allocator = (this->weight_hc_data).allocator;
        m_2.elempack = (this->weight_hc_data).elempack;
        m_2.data = (this->weight_hc_data).data;
        m_2.elemsize = (this->weight_hc_data).elemsize;
        m_2.refcount = (int *)0x0;
        m_2.d = 1;
        m_2.cstep = (long)m_2.h * (long)m_2.w;
        iVar4 = lstm(bottom_blob,top_blob,this->direction,&m,&m_1,&m_2,&hidden,&cell,opt);
        if (m_2.refcount != (int *)0x0) {
          LOCK();
          *m_2.refcount = *m_2.refcount + -1;
          UNLOCK();
          if (*m_2.refcount == 0) {
            if (m_2.allocator == (Allocator *)0x0) {
              if (m_2.data != (void *)0x0) {
                free(m_2.data);
              }
            }
            else {
              (*(m_2.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar3 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (m.allocator == (Allocator *)0x0) {
              if (m.data != (void *)0x0) {
                free(m.data);
              }
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_264 = iVar4;
        if (iVar4 != 0) goto LAB_00221acc;
      }
      if (this->direction == 2) {
        m.cstep = 0;
        m.data = (void *)0x0;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = 0;
        m.elemsize._4_4_ = 0;
        m.elempack = 0;
        m.allocator = (Allocator *)0x0;
        m.dims = 0;
        m.w = 0;
        m.h = 0;
        m.d = 0;
        m.c = 0;
        Mat::create(&m,this->num_output,_h,4,opt->workspace_allocator);
        iVar4 = -100;
        if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
          bVar6 = false;
        }
        else {
          m_1.cstep = 0;
          m_1.data = (void *)0x0;
          m_1.refcount._0_4_ = 0;
          m_1.refcount._4_4_ = 0;
          m_1.elemsize._0_4_ = 0;
          m_1.elemsize._4_4_ = 0;
          m_1.elempack = 0;
          m_1.allocator = (Allocator *)0x0;
          m_1.dims = 0;
          m_1.w = 0;
          m_1.h = 0;
          m_1.d = 0;
          m_1.c = 0;
          Mat::create(&m_1,this->num_output,_h,4,opt->workspace_allocator);
          iVar4 = -100;
          if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
LAB_00221a61:
            bVar6 = false;
          }
          else {
            Mat::channel(&m_2,&this->weight_xc_data,0);
            Mat::channel(&local_78,&this->bias_c_data,0);
            Mat::channel(&local_c0,&this->weight_hc_data,0);
            iVar4 = lstm(bottom_blob,&m,0,&m_2,&local_78,&local_c0,&hidden,&cell,opt);
            Mat::~Mat(&local_c0);
            Mat::~Mat(&local_78);
            Mat::~Mat(&m_2);
            if (iVar4 != 0) goto LAB_00221a61;
            if (0 < hidden.c * (int)hidden.cstep) {
              memset(hidden.data,0,(ulong)(uint)(hidden.c * (int)hidden.cstep) << 2);
            }
            if (0 < cell.c * (int)cell.cstep) {
              memset(cell.data,0,(ulong)(uint)(cell.c * (int)cell.cstep) << 2);
            }
            Mat::channel(&m_2,&this->weight_xc_data,1);
            Mat::channel(&local_78,&this->bias_c_data,1);
            Mat::channel(&local_c0,&this->weight_hc_data,1);
            iVar4 = lstm(bottom_blob,&m_1,1,&m_2,&local_78,&local_c0,&hidden,&cell,opt);
            Mat::~Mat(&local_c0);
            Mat::~Mat(&local_78);
            Mat::~Mat(&m_2);
            bVar6 = iVar4 == 0;
            if ((bVar6) && (iVar4 = local_264, 0 < (int)_h)) {
              uVar5 = 0;
              do {
                __src = (void *)((long)m_1.w * uVar5 *
                                 CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                                (long)m_1.data);
                __dest = (void *)((long)top_blob->w * uVar5 * top_blob->elemsize +
                                 (long)top_blob->data);
                memcpy(__dest,(void *)((long)m.w * uVar5 *
                                       CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                      (long)m.data),(long)this->num_output << 2);
                memcpy((void *)((long)__dest + (long)this->num_output * 4),__src,
                       (long)this->num_output << 2);
                uVar5 = uVar5 + 1;
              } while (_h != uVar5);
            }
          }
          piVar3 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (m_1.allocator == (Allocator *)0x0) {
                if (m_1.data != (void *)0x0) {
                  free(m_1.data);
                }
              }
              else {
                (*(m_1.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (m.allocator == (Allocator *)0x0) {
              if (m.data != (void *)0x0) {
                free(m.data);
              }
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (!bVar6) goto LAB_00221acc;
      }
      iVar4 = 0;
    }
  }
LAB_00221acc:
  piVar3 = (int *)CONCAT44(cell.refcount._4_4_,cell.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (cell.allocator == (Allocator *)0x0) {
        if (cell.data != (void *)0x0) {
          free(cell.data);
        }
      }
      else {
        (*(cell.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00221b08:
  piVar3 = (int *)CONCAT44(hidden.refcount._4_4_,hidden.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (hidden.allocator == (Allocator *)0x0) {
        if (hidden.data != (void *)0x0) {
          free(hidden.data);
        }
      }
      else {
        (*(hidden.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar4;
}

Assistant:

int LSTM::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int T = bottom_blob.h;

    int num_directions = direction == 2 ? 2 : 1;

    // initial hidden state
    Mat hidden(num_output, 4u, opt.workspace_allocator);
    if (hidden.empty())
        return -100;
    hidden.fill(0.f);

    Mat cell(num_output, 4u, opt.workspace_allocator);
    if (cell.empty())
        return -100;
    cell.fill(0.f);

    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, cell, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        int ret0 = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, cell, opt);
        if (ret0 != 0)
            return ret0;

        hidden.fill(0.0f);
        cell.fill(0.0f);

        int ret1 = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden, cell, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    return 0;
}